

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.h
# Opt level: O3

Vector3<double> * __thiscall
S2::GetSurfaceIntegral<Vector3<double>>
          (Vector3<double> *__return_storage_ptr__,S2 *this,S2PointLoopSpan loop,
          _func_Vector3<double>_S2Point_ptr_S2Point_ptr_S2Point_ptr *f_tri)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  FloatType FVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  reference pVVar8;
  reference pVVar9;
  code *pcVar10;
  long lVar11;
  int i;
  int i_00;
  pointer pVVar12;
  bool bVar13;
  S2Point old_origin;
  double local_d0;
  Vector3<double> local_c8;
  undefined1 local_a8 [16];
  S2LogMessage local_98;
  VType local_88;
  Vector3<double> *local_80;
  code *local_78;
  int local_6c;
  S2PointLoopSpan local_68;
  Vector3_d local_58;
  double local_40;
  pointer local_38;
  
  pcVar10 = (code *)loop.super_S2PointSpan.len_;
  local_68.super_S2PointSpan.len_ = (size_type)loop.super_S2PointSpan.ptr_;
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  __return_storage_ptr__->c_[2] = 0.0;
  if ((pointer)0x2 < local_68.super_S2PointSpan.len_) {
    local_68.super_S2PointSpan.ptr_ = (pointer)this;
    pVVar8 = S2PointLoopSpan::operator[](&local_68,0);
    local_c8.c_._0_16_ = *(undefined1 (*) [16])pVVar8->c_;
    dVar1 = 0.0;
    dVar2 = 0.0;
    local_c8.c_[2] = pVVar8->c_[2];
    local_d0 = 0.0;
    dVar5 = 0.0;
    dVar6 = 0.0;
    dVar7 = 0.0;
    if ((pointer)0x2 < local_68.super_S2PointSpan.len_) {
      i = 1;
      pVVar12 = (pointer)0x2;
      local_80 = __return_storage_ptr__;
      local_78 = pcVar10;
      do {
        local_a8._8_4_ = SUB84(dVar2,0);
        local_a8._0_8_ = dVar1;
        local_a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
        if (i != 1) {
          pVVar8 = S2PointLoopSpan::operator[](&local_68,i);
          FVar4 = Vector3<double>::Angle(&local_c8,pVVar8);
          if (3.141582653589793 <= FVar4) {
            local_80->c_[2] = local_d0;
            local_80->c_[0] = (VType)local_a8._0_8_;
            local_80->c_[1] = (VType)local_a8._8_8_;
            S2LogMessage::S2LogMessage
                      (&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.h"
                       ,0xef,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_98.stream_,
                       "Check failed: i == 1 || origin.Angle(loop[i]) < kMaxLength ",0x3b);
            goto LAB_00200489;
          }
        }
        pVVar8 = S2PointLoopSpan::operator[](&local_68,0);
        lVar11 = 0;
        do {
          dVar1 = *(double *)((long)local_c8.c_ + lVar11);
          dVar2 = *(double *)((long)pVVar8->c_ + lVar11);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
          bVar13 = lVar11 != 0x10;
          lVar11 = lVar11 + 8;
        } while (bVar13);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          pVVar8 = S2PointLoopSpan::operator[](&local_68,0);
          if (1e-15 <= ABS(pVVar8->c_[2] * local_c8.c_[2] +
                           local_c8.c_[0] * pVVar8->c_[0] + 0.0 + pVVar8->c_[1] * local_c8.c_[1])) {
            local_80->c_[2] = local_d0;
            local_80->c_[0] = (VType)local_a8._0_8_;
            local_80->c_[1] = (VType)local_a8._8_8_;
            S2LogMessage::S2LogMessage
                      (&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.h"
                       ,0xf0,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_98.stream_,
                       "Check failed: origin == loop[0] || std::fabs(origin.DotProd(loop[0])) < 1e-15 "
                       ,0x4e);
LAB_00200489:
            abort();
          }
        }
        i_00 = (int)pVVar12;
        pVVar8 = S2PointLoopSpan::operator[](&local_68,i_00);
        FVar4 = Vector3<double>::Angle(pVVar8,&local_c8);
        local_6c = i_00;
        local_38 = pVVar12;
        if (3.141582653589793 < FVar4) {
          local_88 = local_c8.c_[2];
          local_98._0_8_ = local_c8.c_[0];
          local_98.stream_ = (ostream *)local_c8.c_[1];
          pVVar8 = S2PointLoopSpan::operator[](&local_68,0);
          lVar11 = 0;
          do {
            dVar1 = *(double *)((long)local_c8.c_ + lVar11);
            dVar2 = *(double *)((long)pVVar8->c_ + lVar11);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
            bVar13 = lVar11 != 0x10;
            lVar11 = lVar11 + 8;
          } while (bVar13);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
            pVVar8 = S2PointLoopSpan::operator[](&local_68,i);
            pVVar9 = S2PointLoopSpan::operator[](&local_68,0);
            local_40 = Vector3<double>::Angle(pVVar8,pVVar9);
            pVVar8 = S2PointLoopSpan::operator[](&local_68,0);
            if (3.141582653589793 <= local_40) {
              local_c8.c_[2] =
                   (double)local_98.stream_ * pVVar8->c_[0] - pVVar8->c_[1] * (double)local_98._0_8_
              ;
              local_c8.c_[1] = (double)local_98._0_8_ * pVVar8->c_[2] - pVVar8->c_[0] * local_88;
              local_c8.c_[0] = local_88 * pVVar8->c_[1] - pVVar8->c_[2] * (double)local_98.stream_;
              pVVar8 = S2PointLoopSpan::operator[](&local_68,0);
              pcVar10 = local_78;
              (*local_78)(&local_58,pVVar8,&local_98,&local_c8);
              dVar1 = (double)local_a8._8_8_ + local_58.c_[1];
              local_a8._8_4_ = SUB84(dVar1,0);
              local_a8._0_8_ = (double)local_a8._0_8_ + local_58.c_[0];
              local_a8._12_4_ = (int)((ulong)dVar1 >> 0x20);
              local_d0 = local_d0 + local_58.c_[2];
            }
            else {
              local_c8.c_[2] = pVVar8->c_[2];
              local_c8.c_._0_16_ = *(undefined1 (*) [16])pVVar8->c_;
              pcVar10 = local_78;
            }
          }
          else {
            pVVar8 = S2PointLoopSpan::operator[](&local_68,0);
            pVVar9 = S2PointLoopSpan::operator[](&local_68,i);
            RobustCrossProd(&local_58,pVVar8,pVVar9);
            dVar1 = SQRT(local_58.c_[1] * local_58.c_[1] + local_58.c_[0] * local_58.c_[0] +
                         local_58.c_[2] * local_58.c_[2]);
            dVar1 = (double)(~-(ulong)(dVar1 != 0.0) & (ulong)dVar1 |
                            (ulong)(1.0 / dVar1) & -(ulong)(dVar1 != 0.0));
            local_c8.c_[2] = dVar1 * local_58.c_[2];
            local_c8.c_[1]._0_4_ = SUB84(dVar1 * local_58.c_[1],0);
            local_c8.c_[0] = dVar1 * local_58.c_[0];
            local_c8.c_[1]._4_4_ = (int)((ulong)(dVar1 * local_58.c_[1]) >> 0x20);
            pcVar10 = local_78;
          }
          pVVar8 = S2PointLoopSpan::operator[](&local_68,i);
          (*pcVar10)(&local_58,&local_98,pVVar8,&local_c8);
          dVar1 = (double)local_a8._8_8_ + local_58.c_[1];
          local_a8._8_4_ = SUB84(dVar1,0);
          local_a8._0_8_ = (double)local_a8._0_8_ + local_58.c_[0];
          local_a8._12_4_ = (int)((ulong)dVar1 >> 0x20);
          local_d0 = local_d0 + local_58.c_[2];
        }
        pVVar8 = S2PointLoopSpan::operator[](&local_68,i);
        i = local_6c;
        S2PointLoopSpan::operator[](&local_68,local_6c);
        (*pcVar10)(&local_98,&local_c8,pVVar8);
        dVar1 = (double)local_a8._0_8_ + (double)local_98._0_8_;
        dVar2 = (double)local_a8._8_8_ + (double)local_98.stream_;
        local_d0 = local_d0 + local_88;
        pVVar12 = (pointer)((long)local_38->c_ + 1);
      } while (pVVar12 < local_68.super_S2PointSpan.len_);
      local_80->c_[1] = dVar2;
      local_80->c_[2] = local_d0;
      __return_storage_ptr__ = local_80;
      dVar5 = dVar1;
      dVar6 = dVar2;
      dVar7 = local_d0;
    }
    local_a8._8_4_ = SUB84(dVar6,0);
    local_a8._0_8_ = dVar5;
    local_a8._12_4_ = (int)((ulong)dVar6 >> 0x20);
    __return_storage_ptr__->c_[0] = dVar5;
    pVVar8 = S2PointLoopSpan::operator[](&local_68,0);
    lVar11 = 0;
    do {
      dVar1 = *(double *)((long)local_c8.c_ + lVar11);
      dVar2 = *(double *)((long)pVVar8->c_ + lVar11);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar13 = lVar11 != 0x10;
      lVar11 = lVar11 + 8;
    } while (bVar13);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      pVVar8 = S2PointLoopSpan::operator[](&local_68,(int)local_68.super_S2PointSpan.len_ + -1);
      pVVar9 = S2PointLoopSpan::operator[](&local_68,0);
      (*pcVar10)(&local_98,&local_c8,pVVar8,pVVar9);
      auVar3._8_4_ = SUB84((double)local_a8._8_8_ + (double)local_98.stream_,0);
      auVar3._0_8_ = (double)local_a8._0_8_ + (double)local_98._0_8_;
      auVar3._12_4_ = (int)((ulong)((double)local_a8._8_8_ + (double)local_98.stream_) >> 0x20);
      *(undefined1 (*) [16])__return_storage_ptr__->c_ = auVar3;
      __return_storage_ptr__->c_[2] = dVar7 + local_88;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T GetSurfaceIntegral(S2PointLoopSpan loop,
                     T f_tri(const S2Point&, const S2Point&, const S2Point&)) {
  // We sum "f_tri" over a collection T of oriented triangles, possibly
  // overlapping.  Let the sign of a triangle be +1 if it is CCW and -1
  // otherwise, and let the sign of a point "x" be the sum of the signs of the
  // triangles containing "x".  Then the collection of triangles T is chosen
  // such that either:
  //
  //  (1) Each point in the loop interior has sign +1, and sign 0 otherwise; or
  //  (2) Each point in the loop exterior has sign -1, and sign 0 otherwise.
  //
  // The triangles basically consist of a "fan" from vertex 0 to every loop
  // edge that does not include vertex 0.  These triangles will always satisfy
  // either (1) or (2).  However, what makes this a bit tricky is that
  // spherical edges become numerically unstable as their length approaches
  // 180 degrees.  Of course there is not much we can do if the loop itself
  // contains such edges, but we would like to make sure that all the triangle
  // edges under our control (i.e., the non-loop edges) are stable.  For
  // example, consider a loop around the equator consisting of four equally
  // spaced points.  This is a well-defined loop, but we cannot just split it
  // into two triangles by connecting vertex 0 to vertex 2.
  //
  // We handle this type of situation by moving the origin of the triangle fan
  // whenever we are about to create an unstable edge.  We choose a new
  // location for the origin such that all relevant edges are stable.  We also
  // create extra triangles with the appropriate orientation so that the sum
  // of the triangle signs is still correct at every point.

  // The maximum length of an edge for it to be considered numerically stable.
  // The exact value is fairly arbitrary since it depends on the stability of
  // the "f_tri" function.  The value below is quite conservative but could be
  // reduced further if desired.
  static const double kMaxLength = M_PI - 1e-5;

  // The default constructor for T must initialize the value to zero.
  // (This is true for built-in types such as "double".)
  T sum = T();
  if (loop.size() < 3) return sum;

  S2Point origin = loop[0];
  for (int i = 1; i + 1 < loop.size(); ++i) {
    // Let V_i be loop[i], let O be the current origin, and let length(A,B)
    // be the length of edge (A,B).  At the start of each loop iteration, the
    // "leading edge" of the triangle fan is (O,V_i), and we want to extend
    // the triangle fan so that the leading edge is (O,V_i+1).
    //
    // Invariants:
    //  1. length(O,V_i) < kMaxLength for all (i > 1).
    //  2. Either O == V_0, or O is approximately perpendicular to V_0.
    //  3. "sum" is the oriented integral of f over the area defined by
    //     (O, V_0, V_1, ..., V_i).
    S2_DCHECK(i == 1 || origin.Angle(loop[i]) < kMaxLength);
    S2_DCHECK(origin == loop[0] || std::fabs(origin.DotProd(loop[0])) < 1e-15);

    if (loop[i + 1].Angle(origin) > kMaxLength) {
      // We are about to create an unstable edge, so choose a new origin O'
      // for the triangle fan.
      S2Point old_origin = origin;
      if (origin == loop[0]) {
        // The following point is well-separated from V_i and V_0 (and
        // therefore V_i+1 as well).
        origin = S2::RobustCrossProd(loop[0], loop[i]).Normalize();
      } else if (loop[i].Angle(loop[0]) < kMaxLength) {
        // All edges of the triangle (O, V_0, V_i) are stable, so we can
        // revert to using V_0 as the origin.
        origin = loop[0];
      } else {
        // (O, V_i+1) and (V_0, V_i) are antipodal pairs, and O and V_0 are
        // perpendicular.  Therefore V_0.CrossProd(O) is approximately
        // perpendicular to all of {O, V_0, V_i, V_i+1}, and we can choose
        // this point O' as the new origin.
        origin = loop[0].CrossProd(old_origin);

        // Advance the edge (V_0,O) to (V_0,O').
        sum += f_tri(loop[0], old_origin, origin);
      }
      // Advance the edge (O,V_i) to (O',V_i).
      sum += f_tri(old_origin, loop[i], origin);
    }
    // Advance the edge (O,V_i) to (O,V_i+1).
    sum += f_tri(origin, loop[i], loop[i+1]);
  }
  // If the origin is not V_0, we need to sum one more triangle.
  if (origin != loop[0]) {
    // Advance the edge (O,V_n-1) to (O,V_0).
    sum += f_tri(origin, loop[loop.size() - 1], loop[0]);
  }
  return sum;
}